

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitBrOn
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,BrOn *curr)

{
  Name breakTo;
  Name breakTo_00;
  Name breakTo_01;
  bool bVar1;
  Literal local_1c0;
  size_t local_1a8;
  char *pcStack_1a0;
  Literal local_190;
  undefined8 local_178;
  undefined8 uStack_170;
  Literal *local_168;
  Literal *value;
  Flow flow;
  Literal local_100;
  size_t local_e8;
  char *pcStack_e0;
  Literal *local_d8;
  Literal *result;
  size_t local_b8;
  char *pcStack_b0;
  Literal local_a8;
  Literal *local_90;
  Literal *original;
  Flow *local_78;
  Flow *breaking;
  Cast cast;
  BrOn *curr_local;
  ExpressionRunner<wasm::ModuleRunner> *this_local;
  
  cast.state.
  super__Variant_base<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
  .
  super__Move_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
  .
  super__Copy_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
  .
  super__Move_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
  .
  super__Copy_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
  .
  super__Variant_storage_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
  ._72_8_ = curr;
  if ((curr->op == BrOnCast) || (curr->op == BrOnCastFail)) {
    doCast<wasm::BrOn>((Cast *)&breaking,this,curr);
    local_78 = Cast::getBreaking((Cast *)&breaking);
    if (local_78 == (Flow *)0x0) {
      local_90 = Cast::getFailure((Cast *)&breaking);
      if (local_90 == (Literal *)0x0) {
        local_d8 = Cast::getSuccess((Cast *)&breaking);
        if (local_d8 == (Literal *)0x0) {
          __assert_fail("result",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                        ,0x5d8,
                        "Flow wasm::ExpressionRunner<wasm::ModuleRunner>::visitBrOn(BrOn *) [SubType = wasm::ModuleRunner]"
                       );
        }
        if (*(int *)(cast.state.
                     super__Variant_base<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                     .
                     super__Move_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                     .
                     super__Copy_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                     .
                     super__Move_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                     .
                     super__Copy_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                     .
                     super__Variant_storage_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                     ._72_8_ + 0x10) == 2) {
          local_e8 = *(size_t *)
                      (cast.state.
                       super__Variant_base<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                       .
                       super__Move_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                       .
                       super__Copy_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                       .
                       super__Move_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                       .
                       super__Copy_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                       .
                       super__Variant_storage_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                       ._72_8_ + 0x18);
          pcStack_e0 = *(char **)(cast.state.
                                  super__Variant_base<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                                  .
                                  super__Move_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                                  .
                                  super__Copy_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                                  .
                                  super__Move_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                                  .
                                  super__Copy_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                                  .
                                  super__Variant_storage_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                                  ._72_8_ + 0x20);
          wasm::Literal::Literal(&local_100,local_d8);
          breakTo_00.super_IString.str._M_str = pcStack_e0;
          breakTo_00.super_IString.str._M_len = local_e8;
          Flow::Flow(__return_storage_ptr__,breakTo_00,&local_100);
          wasm::Literal::~Literal(&local_100);
        }
        else {
          wasm::Literal::Literal((Literal *)&flow.breakTo.super_IString.str._M_str,local_d8);
          Flow::Flow(__return_storage_ptr__,(Literal *)&flow.breakTo.super_IString.str._M_str);
          wasm::Literal::~Literal((Literal *)&flow.breakTo.super_IString.str._M_str);
        }
      }
      else if (*(int *)(cast.state.
                        super__Variant_base<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                        .
                        super__Move_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                        .
                        super__Copy_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                        .
                        super__Move_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                        .
                        super__Copy_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                        .
                        super__Variant_storage_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                        ._72_8_ + 0x10) == 2) {
        wasm::Literal::Literal(&local_a8,local_90);
        Flow::Flow(__return_storage_ptr__,&local_a8);
        wasm::Literal::~Literal(&local_a8);
      }
      else {
        local_b8 = *(size_t *)
                    (cast.state.
                     super__Variant_base<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                     .
                     super__Move_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                     .
                     super__Copy_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                     .
                     super__Move_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                     .
                     super__Copy_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                     .
                     super__Variant_storage_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                     ._72_8_ + 0x18);
        pcStack_b0 = *(char **)(cast.state.
                                super__Variant_base<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                                .
                                super__Move_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                                .
                                super__Copy_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                                .
                                super__Move_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                                .
                                super__Copy_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                                .
                                super__Variant_storage_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                                ._72_8_ + 0x20);
        wasm::Literal::Literal((Literal *)&result,local_90);
        breakTo_01.super_IString.str._M_str = pcStack_b0;
        breakTo_01.super_IString.str._M_len = local_b8;
        Flow::Flow(__return_storage_ptr__,breakTo_01,(Literal *)&result);
        wasm::Literal::~Literal((Literal *)&result);
      }
    }
    else {
      Flow::Flow(__return_storage_ptr__,local_78);
    }
    original._0_4_ = 1;
    Cast::~Cast((Cast *)&breaking);
  }
  else {
    visit((Flow *)&value,this,curr->ref);
    bVar1 = Flow::breaking((Flow *)&value);
    if (bVar1) {
      Flow::Flow(__return_storage_ptr__,(Flow *)&value);
    }
    else {
      local_168 = Flow::getSingleValue((Flow *)&value);
      if (*(int *)(cast.state.
                   super__Variant_base<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                   .
                   super__Move_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                   .
                   super__Copy_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                   .
                   super__Move_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                   .
                   super__Copy_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                   .
                   super__Variant_storage_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                   ._72_8_ + 0x10) == 0) {
        bVar1 = wasm::Literal::isNull(local_168);
        if (bVar1) {
          local_178 = (((IString *)
                       (cast.state.
                        super__Variant_base<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                        .
                        super__Move_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                        .
                        super__Copy_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                        .
                        super__Move_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                        .
                        super__Copy_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                        .
                        super__Variant_storage_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                        ._72_8_ + 0x18))->str)._M_len;
          uStack_170 = *(undefined8 *)
                        (cast.state.
                         super__Variant_base<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                         .
                         super__Move_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                         .
                         super__Copy_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                         .
                         super__Move_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                         .
                         super__Copy_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                         .
                         super__Variant_storage_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                         ._72_8_ + 0x20);
          Flow::Flow(__return_storage_ptr__,
                     (Name)((IString *)
                           (cast.state.
                            super__Variant_base<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                            .
                            super__Move_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                            .
                            super__Copy_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                            .
                            super__Move_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                            .
                            super__Copy_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                            .
                            super__Variant_storage_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                            ._72_8_ + 0x18))->str);
        }
        else {
          wasm::Literal::Literal(&local_190,local_168);
          Flow::Flow(__return_storage_ptr__,&local_190);
          wasm::Literal::~Literal(&local_190);
        }
      }
      else {
        bVar1 = wasm::Literal::isNull(local_168);
        if (bVar1) {
          Flow::Flow(__return_storage_ptr__);
        }
        else {
          local_1a8 = *(size_t *)
                       (cast.state.
                        super__Variant_base<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                        .
                        super__Move_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                        .
                        super__Copy_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                        .
                        super__Move_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                        .
                        super__Copy_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                        .
                        super__Variant_storage_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                        ._72_8_ + 0x18);
          pcStack_1a0 = *(char **)(cast.state.
                                   super__Variant_base<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                                   .
                                   super__Move_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                                   .
                                   super__Copy_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                                   .
                                   super__Move_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                                   .
                                   super__Copy_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                                   .
                                   super__Variant_storage_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                                   ._72_8_ + 0x20);
          wasm::Literal::Literal(&local_1c0,local_168);
          breakTo.super_IString.str._M_str = pcStack_1a0;
          breakTo.super_IString.str._M_len = local_1a8;
          Flow::Flow(__return_storage_ptr__,breakTo,&local_1c0);
          wasm::Literal::~Literal(&local_1c0);
        }
      }
    }
    original._0_4_ = 1;
    Flow::~Flow((Flow *)&value);
  }
  return __return_storage_ptr__;
}

Assistant:

Flow visitBrOn(BrOn* curr) {
    NOTE_ENTER("BrOn");
    // BrOnCast* uses the casting infrastructure, so handle them first.
    if (curr->op == BrOnCast || curr->op == BrOnCastFail) {
      auto cast = doCast(curr);
      if (auto* breaking = cast.getBreaking()) {
        return *breaking;
      } else if (auto* original = cast.getFailure()) {
        if (curr->op == BrOnCast) {
          return *original;
        } else {
          return Flow(curr->name, *original);
        }
      } else {
        auto* result = cast.getSuccess();
        assert(result);
        if (curr->op == BrOnCast) {
          return Flow(curr->name, *result);
        } else {
          return *result;
        }
      }
    }
    // Otherwise we are just checking for null.
    Flow flow = visit(curr->ref);
    if (flow.breaking()) {
      return flow;
    }
    const auto& value = flow.getSingleValue();
    NOTE_EVAL1(value);
    if (curr->op == BrOnNull) {
      // BrOnNull does not propagate the value if it takes the branch.
      if (value.isNull()) {
        return Flow(curr->name);
      }
      // If the branch is not taken, we return the non-null value.
      return {value};
    } else {
      // BrOnNonNull does not return a value if it does not take the branch.
      if (value.isNull()) {
        return Flow();
      }
      // If the branch is taken, we send the non-null value.
      return Flow(curr->name, value);
    }
  }